

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool qt_normalizePathSegments(QString *path,PathNormalizations flags)

{
  QChar *pQVar1;
  QChar *pQVar2;
  QChar *pQVar3;
  char16_t cVar4;
  char16_t *pcVar5;
  ulong uVar6;
  qsizetype qVar7;
  Data *pDVar8;
  QChar *pQVar9;
  bool bVar10;
  QChar *pQVar11;
  qsizetype len;
  ulong uVar12;
  QChar *__length;
  QChar *pQVar13;
  char16_t cVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = (path->d).ptr;
  uVar6 = (path->d).size;
  uVar18 = 0;
  if (uVar6 != 0) {
    uVar18 = (ulong)(*pcVar5 == L'/');
  }
  uVar16 = uVar6;
  if (uVar6 < uVar18) {
    uVar16 = uVar18;
  }
  bVar10 = true;
  for (uVar12 = uVar18; uVar17 = uVar16, uVar12 < uVar6; uVar12 = uVar12 + 1) {
    cVar14 = pcVar5[uVar12];
    if (bVar10) {
      if (cVar14 == L'.') {
        uVar17 = uVar12;
        if (uVar6 - 1 == uVar12) break;
        cVar4 = pcVar5[uVar12 + 1];
        if (cVar4 == L'.') {
          if (uVar6 - 2 == uVar12) break;
          cVar4 = pcVar5[uVar12 + 2];
        }
        if (cVar4 == L'/') break;
      }
      if ((((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                  super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0) &&
         (uVar12 != 0 && cVar14 == L'/')) {
        uVar17 = uVar12 - 1;
        break;
      }
    }
    bVar10 = cVar14 == L'/';
  }
  bVar10 = true;
  if (uVar17 != uVar6) {
    pQVar11 = QString::data(path);
    __length = pQVar11 + uVar18;
    pQVar3 = pQVar11 + (path->d).size;
    pQVar11 = pQVar11 + uVar17;
    bVar15 = 1;
    pQVar13 = pQVar11;
    do {
      cVar14 = pQVar11->ucs;
      if (cVar14 == L'/') {
        do {
          pQVar13->ucs = L'/';
          pQVar13 = pQVar13 + 1;
          do {
            pQVar11 = pQVar11 + 1;
            cVar14 = pQVar11->ucs;
            if ((pQVar3 <= pQVar11) || (cVar14 != L'/')) goto LAB_0012895e;
          } while (((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                          super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0);
        } while( true );
      }
LAB_0012895e:
      if (cVar14 == L'.') {
        pQVar9 = pQVar11 + 1;
        if ((pQVar9 != pQVar3) && (pQVar9->ucs != L'/')) {
          if ((pQVar9->ucs != L'.') ||
             ((pQVar1 = pQVar11 + 2, pQVar1 != pQVar3 && (pQVar1->ucs != L'/')))) goto LAB_001289ed;
          if (pQVar13 == __length) {
            if (((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                       super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0) {
              *(undefined4 *)pQVar13 = 0x2e002e;
              if (pQVar1 == pQVar3) {
                __length = pQVar13 + 2;
              }
              else {
                pQVar13[2].ucs = L'/';
                __length = pQVar13 + 3;
                pQVar11 = pQVar9;
              }
              pQVar11 = pQVar11 + 2;
              bVar15 = 0;
              pQVar13 = __length;
              goto LAB_001289df;
            }
            bVar15 = 0;
          }
          pQVar11 = pQVar13 + (pQVar13 <= __length);
          do {
            pQVar13 = pQVar11 + -1;
            pQVar9 = pQVar1;
            if (pQVar13 <= __length) break;
            pQVar2 = pQVar11 + -2;
            pQVar11 = pQVar13;
          } while (pQVar2->ucs != L'/');
        }
        pQVar11 = pQVar9;
        if (((pQVar11 != pQVar3) && (__length < pQVar13)) && (pQVar13[-1].ucs == L'/')) {
          pQVar13 = pQVar13 + -1;
        }
        if (pQVar13 == __length) {
          if (pQVar11 != pQVar3) {
            pQVar11 = pQVar11 + (pQVar11->ucs == L'/');
          }
          for (; ((uVar18 == 0 && (pQVar11 != pQVar3)) && (pQVar11->ucs == L'/'));
              pQVar11 = pQVar11 + 1) {
          }
        }
      }
      else {
LAB_001289ed:
        for (; (pQVar11 < pQVar3 && (pQVar11->ucs != L'/')); pQVar11 = pQVar11 + 1) {
          pQVar13->ucs = pQVar11->ucs;
          pQVar13 = pQVar13 + 1;
        }
      }
LAB_001289df:
    } while (pQVar11 < pQVar3);
    QString::truncate(path,(char *)((long)pQVar13 - (long)(path->d).ptr >> 1),(__off_t)__length);
    if ((((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0) &&
       ((path->d).size == 0)) {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L".",1);
      pDVar8 = (path->d).d;
      pcVar5 = (path->d).ptr;
      (path->d).d = local_48.d;
      (path->d).ptr = local_48.ptr;
      qVar7 = (path->d).size;
      (path->d).size = local_48.size;
      local_48.d = pDVar8;
      local_48.ptr = pcVar5;
      local_48.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    bVar10 = (bool)(uVar18 == 0 | bVar15);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool qt_normalizePathSegments(QString *path, QDirPrivate::PathNormalizations flags)
{
    const bool isRemote = flags.testAnyFlag(QDirPrivate::RemotePath);
    const qsizetype prefixLength = rootLength(*path, flags);

    // RFC 3986 says: "The input buffer is initialized with the now-appended
    // path components and the output buffer is initialized to the empty
    // string."
    const QChar *in = path->constBegin();

    // Scan the input for a "." or ".." segment. If there isn't any, we may not
    // need to modify this path at all. Also scan for "//" segments, which
    // will be normalized if the path is local.
    qsizetype i = prefixLength;
    qsizetype n = path->size();
    for (bool lastWasSlash = true; i < n; ++i) {
        if (lastWasSlash && in[i] == u'.') {
            if (i + 1 == n || in[i + 1] == u'/')
                break;
            if (in[i + 1] == u'.' && (i + 2 == n || in[i + 2] == u'/'))
                break;
        }
        if (!isRemote && lastWasSlash && in[i] == u'/' && i > 0) {
            // backtrack one, so the algorithm below gobbles up the remaining
            // slashes
            --i;
            break;
        }
        lastWasSlash = in[i] == u'/';
    }
    if (i == n)
        return true;

    QChar *out = path->data();  // detaches
    const QChar *start = out + prefixLength;
    const QChar *end = out + path->size();
    out += i;
    in = out;

    // We implement a modified algorithm compared to RFC 3986, for efficiency.
    bool ok = true;
    do {
#if 0   // to see in the debugger
        QString output = QStringView(path->constBegin(), out).toString();
        QStringView input(in, end);
#endif

        // First, copy the preceding slashes, so we can look at the segment's
        // content. If the path is part of a URL, we copy all slashes, otherwise
        // just one.
        if (in[0] == u'/') {
            *out++ = *in++;
            while (in < end && in[0] == u'/') {
                if (isRemote)
                    *out++ = *in++;
                else
                    ++in; // Skip multiple slashes for local URLs

                // Note: we may exit this loop with in == end, in which case we
                // *shouldn't* dereference *in. But since we are pointing to a
                // detached, non-empty QString, we know there's a u'\0' at the
                // end, so dereferencing is safe.
            }
        }

        // Is this path segment either "." or ".."?
        enum { Nothing, Dot, DotDot } type = Nothing;
        if (in[0] == u'.') {
            if (in + 1 == end || in[1] == u'/')
                type = Dot;
            else if (in[1] == u'.' && (in + 2 == end || in[2] == u'/'))
                type = DotDot;
        }
        if (type == Nothing) {
            // If it is neither, then we copy this segment.
            while (in < end && in[0] != u'/')
                *out++ = *in++;
            continue;
        }

        // Otherwise, we skip it and remove preceding slashes (if
        // any, exactly one if part of a URL, all otherwise) from the
        // output. If it is "..", we remove the segment before that and
        // preceding slashes too in a similar fashion, if they are there.
        if (type == DotDot) {
            if (Q_UNLIKELY(out == start)) {
                // we can't go further up from here, so we "re-root"
                // without cleaning this segment
                ok = false;
                if (!isRemote) {
                    *out++ = u'.';
                    *out++ = u'.';
                    if (in + 2 != end) {
                        Q_ASSERT(in[2] == u'/');
                        *out++ = u'/';
                        ++in;
                    }
                    start = out;
                    in += 2;
                    continue;
                }
            }

            if (out > start)
                --out; // backtrack the first dot
            // backtrack the previous path segment
            while (out > start && out[-1] != u'/')
                --out;
            in += 2;    // the two dots
        } else {
            ++in;       // the one dot
        }

        // Not at 'end' yet, prepare for the next loop iteration by backtracking one slash.
        // E.g.: /a/b/../c    >>> /a/b/../c
        //          ^out            ^out
        // the next iteration will copy '/c' to the output buffer >>> /a/c
        if (in != end && out > start && out[-1] == u'/')
            --out;
        if (out == start) {
            // We've reached the root. Make sure we don't turn a relative path
            // to absolute or, in the case of local paths that are already
            // absolute, into UNC.
            // Note: this will turn ".//a" into "a" even for URLs!
            if (in != end && in[0] == u'/')
                ++in;
            while (prefixLength == 0 && in != end && in[0] == u'/')
                ++in;
        }
    } while (in < end);

    path->truncate(out - path->constBegin());
    if (!isRemote && path->isEmpty())
        *path = u"."_s;

    // we return false only if the path was absolute
    return ok || prefixLength == 0;
}